

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O1

X509_STORE * X509_STORE_new(void)

{
  X509_STORE *v;
  OPENSSL_STACK *pOVar1;
  X509_VERIFY_PARAM *pXVar2;
  
  v = (X509_STORE *)OPENSSL_zalloc(0x60);
  if (v != (X509_STORE *)0x0) {
    *(undefined4 *)&v->cert_crl = 1;
    CRYPTO_MUTEX_init((CRYPTO_MUTEX *)&v->objs);
    pOVar1 = OPENSSL_sk_new(x509_object_cmp_sk);
    *(OPENSSL_STACK **)v = pOVar1;
    pOVar1 = OPENSSL_sk_new_null();
    v->check_revocation = (_func_1847 *)pOVar1;
    pXVar2 = X509_VERIFY_PARAM_new();
    v->get_crl = (_func_1848 *)pXVar2;
    if ((*(long *)v != 0) &&
       (pXVar2 != (X509_VERIFY_PARAM *)0x0 && v->check_revocation != (_func_1847 *)0x0)) {
      return v;
    }
    X509_STORE_free(v);
  }
  return (X509_STORE *)0x0;
}

Assistant:

X509_STORE *X509_STORE_new(void) {
  X509_STORE *ret =
      reinterpret_cast<X509_STORE *>(OPENSSL_zalloc(sizeof(X509_STORE)));
  if (ret == NULL) {
    return NULL;
  }

  ret->references = 1;
  CRYPTO_MUTEX_init(&ret->objs_lock);
  ret->objs = sk_X509_OBJECT_new(x509_object_cmp_sk);
  ret->get_cert_methods = sk_X509_LOOKUP_new_null();
  ret->param = X509_VERIFY_PARAM_new();
  if (ret->objs == NULL || ret->get_cert_methods == NULL ||
      ret->param == NULL) {
    X509_STORE_free(ret);
    return NULL;
  }

  return ret;
}